

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleDisplay::text(QString *__return_storage_ptr__,QAccessibleDisplay *this,Text t)

{
  double dVar1;
  Data *pDVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  char cVar6;
  TextFormat TVar7;
  int iVar8;
  QWidget *pQVar9;
  QObject *pQVar10;
  QLabel *pQVar11;
  QProgressBar *pQVar12;
  ulong uVar13;
  QLCDNumber *pQVar14;
  QStatusBar *pQVar15;
  long in_FS_OFFSET;
  QAnyStringView QVar16;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  if (t == Value) {
    pQVar10 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar12 = QtPrivate::qobject_cast_helper<QProgressBar*,QObject>(pQVar10);
    if (pQVar12 != (QProgressBar *)0x0) {
      pQVar10 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar12 = QtPrivate::qobject_cast_helper<QProgressBar*,QObject>(pQVar10);
      iVar8 = QProgressBar::value(pQVar12);
LAB_004d7636:
      QString::number((int)&local_78,iVar8);
LAB_004d7648:
      uVar13 = local_58.size;
      pcVar4 = local_58.ptr;
      pDVar2 = local_58.d;
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_78.d = pDVar2;
      local_78.ptr = pcVar4;
      local_58.size = local_78.size;
LAB_004d7668:
      local_78.size = uVar13;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    }
LAB_004d7674:
    uVar13 = local_58.size;
    if (local_58.size == 0) {
      QAccessibleWidget::text((QString *)&local_78,&this->super_QAccessibleWidget,t);
      qVar5 = local_58.size;
      pcVar4 = local_58.ptr;
      pDVar2 = local_58.d;
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_78.d = pDVar2;
      local_78.ptr = pcVar4;
      local_58.size = local_78.size;
      local_78.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      uVar13 = local_58.size;
    }
  }
  else {
    if (t != Name) goto LAB_004d7674;
    pQVar9 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QWidget::accessibleName((QString *)&local_78,pQVar9);
    qVar5 = local_58.size;
    pcVar4 = local_58.ptr;
    pDVar2 = local_58.d;
    local_58.d = local_78.d;
    local_58.ptr = local_78.ptr;
    local_78.d = pDVar2;
    local_78.ptr = pcVar4;
    local_58.size = local_78.size;
    local_78.size = qVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    uVar13 = local_58.size;
    if (local_58.size == 0) {
      pQVar10 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar11 = QtPrivate::qobject_cast_helper<QLabel*,QObject>(pQVar10);
      pQVar10 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      if (pQVar11 == (QLabel *)0x0) {
        pQVar14 = QtPrivate::qobject_cast_helper<QLCDNumber*,QObject>(pQVar10);
        pQVar10 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
        if (pQVar14 != (QLCDNumber *)0x0) {
          pQVar14 = QtPrivate::qobject_cast_helper<QLCDNumber*,QObject>(pQVar10);
          iVar8 = QLCDNumber::digitCount(pQVar14);
          if (iVar8 == 0) {
            iVar8 = QLCDNumber::intValue(pQVar14);
            goto LAB_004d7636;
          }
          dVar1 = QLCDNumber::value(pQVar14);
          QString::number(dVar1,(char)&local_78,0x67);
          goto LAB_004d7648;
        }
        pQVar15 = QtPrivate::qobject_cast_helper<QStatusBar*,QObject>(pQVar10);
        if (pQVar15 != (QStatusBar *)0x0) {
          pQVar10 = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
          pQVar15 = QtPrivate::qobject_cast_helper<QStatusBar*,QObject>(pQVar10);
          QStatusBar::currentMessage(__return_storage_ptr__,pQVar15);
          goto LAB_004d76db;
        }
      }
      else {
        pQVar11 = QtPrivate::qobject_cast_helper<QLabel*,QObject>(pQVar10);
        QLabel::text((QString *)&local_78,pQVar11);
        qVar5 = local_58.size;
        pcVar4 = local_58.ptr;
        pDVar2 = local_58.d;
        local_58.d = local_78.d;
        local_58.ptr = local_78.ptr;
        local_78.d = pDVar2;
        local_78.ptr = pcVar4;
        local_58.size = local_78.size;
        local_78.size = qVar5;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        TVar7 = QLabel::textFormat(pQVar11);
        if (TVar7 == RichText) {
LAB_004d7593:
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
          QTextDocument::QTextDocument((QTextDocument *)&local_88,(QObject *)0x0);
          QTextDocument::setHtml((QString *)&local_88);
          QTextDocument::toPlainText();
          qVar5 = local_58.size;
          pcVar4 = local_58.ptr;
          pDVar2 = local_58.d;
          local_58.d = local_78.d;
          local_58.ptr = local_78.ptr;
          local_78.d = pDVar2;
          local_78.ptr = pcVar4;
          local_58.size = local_78.size;
          local_78.size = qVar5;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QTextDocument::~QTextDocument((QTextDocument *)&local_88);
        }
        else {
          TVar7 = QLabel::textFormat(pQVar11);
          if (TVar7 == AutoText) {
            QVar16.m_size = local_58.size | 0x8000000000000000;
            QVar16.field_0.m_data_utf16 = local_58.ptr;
            cVar6 = Qt::mightBeRichText(QVar16);
            if (cVar6 != '\0') goto LAB_004d7593;
          }
        }
        pQVar9 = QLabel::buddy(pQVar11);
        if (pQVar9 != (QWidget *)0x0) {
          qt_accStripAmp((QString *)&local_78,(QString *)&local_58);
          pDVar2 = local_78.d;
          aVar3.m_data_utf16 = local_78.ptr;
          local_78.d = local_58.d;
          local_78.ptr = local_58.ptr;
          uVar13 = local_58.size;
          local_58.d = pDVar2;
          local_58.ptr = aVar3.m_data_utf16;
          local_58.size = local_78.size;
          goto LAB_004d7668;
        }
      }
      goto LAB_004d7674;
    }
  }
  pcVar4 = local_58.ptr;
  pDVar2 = local_58.d;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pcVar4;
  local_58.size = 0;
  (__return_storage_ptr__->d).size = uVar13;
LAB_004d76db:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleDisplay::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty()) {
            if (false) {
#if QT_CONFIG(label)
            } else if (qobject_cast<QLabel*>(object())) {
                QLabel *label = qobject_cast<QLabel*>(object());
                str = label->text();
#ifndef QT_NO_TEXTHTMLPARSER
                if (label->textFormat() == Qt::RichText
                    || (label->textFormat() == Qt::AutoText && Qt::mightBeRichText(str))) {
                    QTextDocument doc;
                    doc.setHtml(str);
                    str = doc.toPlainText();
                }
#endif
#ifndef QT_NO_SHORTCUT
                if (label->buddy())
                    str = qt_accStripAmp(str);
#endif
#endif // QT_CONFIG(label)
#if QT_CONFIG(lcdnumber)
            } else if (qobject_cast<QLCDNumber*>(object())) {
                QLCDNumber *l = qobject_cast<QLCDNumber*>(object());
                if (l->digitCount())
                    str = QString::number(l->value());
                else
                    str = QString::number(l->intValue());
#endif
#if QT_CONFIG(statusbar)
            } else if (qobject_cast<QStatusBar*>(object())) {
                return qobject_cast<QStatusBar*>(object())->currentMessage();
#endif
            }
        }
        break;
    case QAccessible::Value:
#if QT_CONFIG(progressbar)
        if (qobject_cast<QProgressBar*>(object()))
            str = QString::number(qobject_cast<QProgressBar*>(object())->value());
#endif
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}